

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_panner_init(ma_panner_config *pConfig,ma_panner *pPanner)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (pPanner != (ma_panner *)0x0) {
    pPanner->format = ma_format_unknown;
    pPanner->channels = 0;
    pPanner->mode = ma_pan_mode_balance;
    pPanner->pan = 0.0;
    if (pConfig != (ma_panner_config *)0x0) {
      pPanner->format = pConfig->format;
      pPanner->channels = pConfig->channels;
      pPanner->mode = pConfig->mode;
      pPanner->pan = pConfig->pan;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_panner_init(const ma_panner_config* pConfig, ma_panner* pPanner)
{
    if (pPanner == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pPanner);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    pPanner->format   = pConfig->format;
    pPanner->channels = pConfig->channels;
    pPanner->mode     = pConfig->mode;
    pPanner->pan      = pConfig->pan;

    return MA_SUCCESS;
}